

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re3q3.cc
# Opt level: O3

void re3q3::rotation_to_3q3
               (Matrix<double,_3,_10,_0,_3,_10> *Rcoeffs,Matrix<double,_3,_10,_0,_3,_10> *coeffs)

{
  double dVar1;
  long lVar2;
  
  lVar2 = -3;
  do {
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 3] = ((Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                   m_storage.m_data.array[lVar2 + 3] -
                  ((Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                   m_storage.m_data.array[lVar2 + 0xf] +
                  (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                  m_storage.m_data.array[lVar2 + 0x1b])) +
                  Rcoeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                  m_storage.m_data.array[lVar2];
    dVar1 = (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 0xc] +
            (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 6];
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 6] = dVar1 + dVar1;
    dVar1 = (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 0x15] +
            (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 9];
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 9] = dVar1 + dVar1;
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 0xc] =
         ((Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data
          .array[lVar2 + 0xf] -
         ((Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data
          .array[lVar2 + 3] +
         (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.
         array[lVar2 + 0x1b])) +
         Rcoeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[lVar2];
    dVar1 = (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 0x18] +
            (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 0x12];
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 0xf] = dVar1 + dVar1;
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 0x12] =
         ((Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data
          .array[lVar2 + 0x1b] -
         ((Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data
          .array[lVar2 + 0xf] +
         (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.
         array[lVar2 + 3])) +
         Rcoeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[lVar2];
    dVar1 = (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 0x12] -
            (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 0x18];
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 0x15] = dVar1 + dVar1;
    dVar1 = (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 0x15] -
            (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 9];
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 0x18] = dVar1 + dVar1;
    dVar1 = (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 6] -
            (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array[lVar2 + 0xc];
    (coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
    [lVar2 + 0x1b] = dVar1 + dVar1;
    coeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.array
    [lVar2] = (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
              m_data.array[lVar2 + 0xf] +
              (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
              m_data.array[lVar2 + 3] +
              (Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
              m_data.array[lVar2 + 0x1b] +
              Rcoeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
              m_data.array[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

void rotation_to_3q3(const Eigen::Matrix<double, 3, 10> &Rcoeffs, Eigen::Matrix<double, 3, 10> *coeffs) {
    for (int k = 0; k < 3; k++) {
        (*coeffs)(k, 0) = Rcoeffs(k, 0) - Rcoeffs(k, 4) - Rcoeffs(k, 8) + Rcoeffs(k, 9);
        (*coeffs)(k, 1) = 2 * Rcoeffs(k, 1) + 2 * Rcoeffs(k, 3);
        (*coeffs)(k, 2) = 2 * Rcoeffs(k, 2) + 2 * Rcoeffs(k, 6);
        (*coeffs)(k, 3) = Rcoeffs(k, 4) - Rcoeffs(k, 0) - Rcoeffs(k, 8) + Rcoeffs(k, 9);
        (*coeffs)(k, 4) = 2 * Rcoeffs(k, 5) + 2 * Rcoeffs(k, 7);
        (*coeffs)(k, 5) = Rcoeffs(k, 8) - Rcoeffs(k, 4) - Rcoeffs(k, 0) + Rcoeffs(k, 9);
        (*coeffs)(k, 6) = 2 * Rcoeffs(k, 5) - 2 * Rcoeffs(k, 7);
        (*coeffs)(k, 7) = 2 * Rcoeffs(k, 6) - 2 * Rcoeffs(k, 2);
        (*coeffs)(k, 8) = 2 * Rcoeffs(k, 1) - 2 * Rcoeffs(k, 3);
        (*coeffs)(k, 9) = Rcoeffs(k, 0) + Rcoeffs(k, 4) + Rcoeffs(k, 8) + Rcoeffs(k, 9);
    }
}